

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

string * vformat_abi_cxx11_(string *__return_storage_ptr__,char *fmt,__va_list_tag *args)

{
  uint uVar1;
  size_t sVar2;
  size_type __new_size;
  vector<char,_std::allocator<char>_> result;
  va_list args2;
  allocator<char> local_61;
  vector<char,_std::allocator<char>_> local_60;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  sVar2 = strlen(fmt);
  std::vector<char,_std::allocator<char>_>::vector(&local_60,sVar2 * 2,(allocator_type *)&local_48);
  do {
    local_38 = args->reg_save_area;
    local_48._0_4_ = args->gp_offset;
    local_48._4_4_ = args->fp_offset;
    pvStack_40 = args->overflow_arg_area;
    uVar1 = vsnprintf(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,fmt,(allocator_type *)&local_48);
    if ((int)uVar1 < 0) {
      __new_size = ((long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start) * 2;
    }
    else {
      if ((ulong)uVar1 <
          (ulong)((long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,
                   local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_61);
        if (local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (char *)0x0) {
          operator_delete(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        return __return_storage_ptr__;
      }
      __new_size = (size_type)(uVar1 + 1);
    }
    if (local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    std::vector<char,_std::allocator<char>_>::resize(&local_60,__new_size);
  } while( true );
}

Assistant:

std::string vformat(const char *fmt, va_list args) {
    std::vector<char> result(strlen(fmt) * 2);
    while (true) {
        va_list args2;
        va_copy(args2, args);
        int res = vsnprintf(result.data(), result.size(), fmt, args2);

        if ((res >= 0) && (static_cast<size_t>(res) < result.size())) {
            va_end(args);
            va_end(args2);
            return std::string(result.data());
        }

        size_t size;
        if (res < 0) {
            size = result.size() * 2;
        } else {
            size = static_cast<size_t>(res) + 1;
        }

        result.clear();
        result.resize(size);
        va_end(args2);
    }
}